

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O0

char * restrict_bit_name(long *restrict_flags)

{
  ulong uVar1;
  char *pcVar2;
  long in_RDI;
  __type_conflict2 _Var3;
  char *in_stack_00000008;
  int i;
  long in_stack_ffffffffffffffd8;
  int local_c;
  
  restrict_bit_name::buf[0] = '\0';
  local_c = 0;
  while (restrict_table[local_c].name != (char *)0x0) {
    uVar1 = *(ulong *)(in_RDI + (long)(int)(restrict_table[local_c].bit / 0x20) * 8);
    _Var3 = std::pow<int,long>((int)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffffd8);
    if ((uVar1 & (long)_Var3) != 0) {
      strcat(restrict_bit_name::buf," ");
      pcVar2 = palloc_string(in_stack_00000008);
      strcat(restrict_bit_name::buf,pcVar2);
    }
    local_c = local_c + 1;
  }
  pcVar2 = " none";
  if (restrict_bit_name::buf[0] != '\0') {
    pcVar2 = restrict_bit_name::buf;
  }
  return pcVar2 + 1;
}

Assistant:

char *restrict_bit_name(long restrict_flags[])
{
	static char buf[512];
	buf[0] = '\0';

	for (int i = 0; restrict_table[i].name != nullptr; i++)
	{
		if (IS_SET(restrict_flags, restrict_table[i].bit))
		{
			strcat(buf, " ");
			strcat(buf, palloc_string(restrict_table[i].name));
		}
	}

	return (buf[0] != '\0') ? buf + 1 : (char *)"none";
}